

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_set_trap_timeout
                (chunk_conflict2 *c,loc_conflict grid,_Bool domsg,wchar_t t_idx,wchar_t time)

{
  trap *ptVar1;
  _Bool _Var2;
  square_conflict *psVar3;
  trap *next_trap;
  trap *current_trap;
  _Bool disabled;
  wchar_t time_local;
  wchar_t t_idx_local;
  _Bool domsg_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  current_trap._3_1_ = false;
  _Var2 = square_in_bounds((chunk *)c,grid);
  if (!_Var2) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                  ,0x292,
                  "_Bool square_set_trap_timeout(struct chunk *, struct loc, _Bool, int, int)");
  }
  psVar3 = square((chunk *)c,grid);
  ptVar1 = psVar3->trap;
  do {
    while( true ) {
      next_trap = ptVar1;
      if (next_trap == (trap *)0x0) goto LAB_00225fb6;
      ptVar1 = next_trap->next;
      if ((L'\xffffffff' < t_idx) && (t_idx != (uint)next_trap->t_idx)) break;
      next_trap->timeout = (uint8_t)time;
      current_trap._3_1_ = true;
      if (domsg) {
        msg("You have disabled the %s.",next_trap->kind->name);
      }
    }
  } while (ptVar1 != (trap *)0x0);
LAB_00225fb6:
  _Var2 = square_isseen((chunk *)c,grid);
  if (_Var2) {
    square_memorize_traps(c,grid);
    square_light_spot((chunk *)c,(loc)grid);
  }
  return current_trap._3_1_;
}

Assistant:

bool square_set_trap_timeout(struct chunk *c, struct loc grid, bool domsg,
							 int t_idx, int time)
{
	bool disabled = false;
	struct trap *current_trap = NULL;

	/* Bounds check */
	assert(square_in_bounds(c, grid));

	/* Look at the traps in this grid */
	current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* Set the timer */
		current_trap->timeout = time;
		disabled = true;

		/* Message if requested */
		if (domsg) {
			msg("You have disabled the %s.",
				current_trap->kind->name);
		}

		/* Replace with the next trap */
		current_trap = next_trap;
	}

	/* Refresh grids that the character can see */
	if (square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return disabled;
}